

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_aggregate_expression.cpp
# Opt level: O2

hash_t __thiscall duckdb::BoundAggregateExpression::Hash(BoundAggregateExpression *this)

{
  hash_t hVar1;
  hash_t hVar2;
  hash_t hVar3;
  
  hVar1 = Expression::Hash(&this->super_Expression);
  hVar2 = BaseScalarFunction::Hash(&(this->function).super_BaseScalarFunction);
  hVar3 = Hash<bool>(this->aggr_type == DISTINCT);
  return hVar3 ^ hVar2 ^ hVar1;
}

Assistant:

hash_t BoundAggregateExpression::Hash() const {
	hash_t result = Expression::Hash();
	result = CombineHash(result, function.Hash());
	result = CombineHash(result, duckdb::Hash(IsDistinct()));
	return result;
}